

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  size_t sVar23;
  uint uVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  size_t sVar28;
  NodeRef *pNVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  Primitive_conflict4 *prim;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar41;
  float fVar42;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar39;
  float fVar43;
  undefined1 auVar40 [16];
  float fVar44;
  float fVar48;
  float fVar49;
  vint4 ai;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar47;
  float fVar51;
  float fVar53;
  float fVar54;
  vint4 ai_1;
  undefined1 auVar52 [16];
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  vint4 ai_3;
  undefined1 auVar57 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  vint4 bi;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar63;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  vint4 bi_3;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  vint4 bi_1;
  float fVar84;
  float fVar85;
  float fVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  uint uVar95;
  vint4 ai_2;
  uint uVar96;
  uint uVar97;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  uint uVar101;
  vint4 bi_2;
  uint uVar102;
  float fVar103;
  float fVar105;
  float fVar106;
  undefined1 auVar104 [16];
  float fVar107;
  vbool<4> vVar108;
  Precalculations pre;
  ulong local_17b0;
  undefined1 local_17a8 [16];
  vbool<4> valid0;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar28 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar28 != 8) {
    auVar104 = *(undefined1 (*) [16])(ray + 0x80);
    auVar71._0_12_ = ZEXT812(0);
    auVar71._12_4_ = 0;
    uVar87 = -(uint)(0.0 <= auVar104._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar90 = -(uint)(0.0 <= auVar104._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar93 = -(uint)(0.0 <= auVar104._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar96 = -(uint)(0.0 <= auVar104._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar57._4_4_ = uVar90;
    auVar57._0_4_ = uVar87;
    auVar57._8_4_ = uVar93;
    auVar57._12_4_ = uVar96;
    uVar24 = movmskps((int)This->ptr,auVar57);
    uVar25 = (ulong)uVar24;
    if (uVar24 != 0) {
      fVar7 = *(float *)ray;
      fVar8 = *(float *)(ray + 4);
      fVar9 = *(float *)(ray + 8);
      fVar10 = *(float *)(ray + 0xc);
      fVar11 = *(float *)(ray + 0x10);
      fVar12 = *(float *)(ray + 0x14);
      fVar13 = *(float *)(ray + 0x18);
      fVar14 = *(float *)(ray + 0x1c);
      fVar15 = *(float *)(ray + 0x20);
      fVar16 = *(float *)(ray + 0x24);
      fVar17 = *(float *)(ray + 0x28);
      fVar18 = *(float *)(ray + 0x2c);
      auVar57 = *(undefined1 (*) [16])(ray + 0x40);
      fVar75 = (float)DAT_01f80d30;
      fVar78 = DAT_01f80d30._4_4_;
      fVar81 = DAT_01f80d30._8_4_;
      fVar84 = DAT_01f80d30._12_4_;
      auVar45._4_4_ = -(uint)(ABS(auVar57._4_4_) < fVar78);
      auVar45._0_4_ = -(uint)(ABS(auVar57._0_4_) < fVar75);
      auVar45._8_4_ = -(uint)(ABS(auVar57._8_4_) < fVar81);
      auVar45._12_4_ = -(uint)(ABS(auVar57._12_4_) < fVar84);
      auVar45 = blendvps(auVar57,_DAT_01f80d30,auVar45);
      auVar57 = *(undefined1 (*) [16])(ray + 0x50);
      auVar52._4_4_ = -(uint)(ABS(auVar57._4_4_) < fVar78);
      auVar52._0_4_ = -(uint)(ABS(auVar57._0_4_) < fVar75);
      auVar52._8_4_ = -(uint)(ABS(auVar57._8_4_) < fVar81);
      auVar52._12_4_ = -(uint)(ABS(auVar57._12_4_) < fVar84);
      auVar52 = blendvps(auVar57,_DAT_01f80d30,auVar52);
      auVar57 = *(undefined1 (*) [16])(ray + 0x60);
      auVar32._4_4_ = -(uint)(ABS(auVar57._4_4_) < fVar78);
      auVar32._0_4_ = -(uint)(ABS(auVar57._0_4_) < fVar75);
      auVar32._8_4_ = -(uint)(ABS(auVar57._8_4_) < fVar81);
      auVar32._12_4_ = -(uint)(ABS(auVar57._12_4_) < fVar84);
      auVar57 = blendvps(auVar57,_DAT_01f80d30,auVar32);
      auVar71 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar71);
      auVar33._4_4_ = uVar90;
      auVar33._0_4_ = uVar87;
      auVar33._8_4_ = uVar93;
      auVar33._12_4_ = uVar96;
      aVar63.v = (__m128)blendvps(_DAT_01f7a9f0,auVar71,auVar33);
      local_17a8._0_8_ = CONCAT44(uVar90,uVar87) ^ 0xffffffffffffffff;
      local_17a8._8_4_ = uVar93 ^ 0xffffffff;
      local_17a8._12_4_ = uVar96 ^ 0xffffffff;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar28;
      stack_near[1].field_0 = aVar63;
      if (sVar28 != 0xfffffffffffffff8) {
        auVar71 = rcpps(auVar33,auVar45);
        fVar75 = auVar71._0_4_;
        auVar46._0_4_ = auVar45._0_4_ * fVar75;
        fVar78 = auVar71._4_4_;
        auVar46._4_4_ = auVar45._4_4_ * fVar78;
        fVar81 = auVar71._8_4_;
        auVar46._8_4_ = auVar45._8_4_ * fVar81;
        fVar84 = auVar71._12_4_;
        auVar46._12_4_ = auVar45._12_4_ * fVar84;
        auVar71 = rcpps((undefined1  [16])_DAT_01f7a9f0,auVar52);
        fVar76 = auVar71._0_4_;
        fVar79 = auVar71._4_4_;
        fVar82 = auVar71._8_4_;
        fVar85 = auVar71._12_4_;
        auVar71 = rcpps(auVar46,auVar57);
        fVar61 = auVar71._0_4_;
        fVar64 = auVar71._4_4_;
        fVar66 = auVar71._8_4_;
        fVar68 = auVar71._12_4_;
        fVar76 = (1.0 - auVar52._0_4_ * fVar76) * fVar76 + fVar76;
        fVar79 = (1.0 - auVar52._4_4_ * fVar79) * fVar79 + fVar79;
        fVar82 = (1.0 - auVar52._8_4_ * fVar82) * fVar82 + fVar82;
        fVar85 = (1.0 - auVar52._12_4_ * fVar85) * fVar85 + fVar85;
        fVar75 = (1.0 - auVar46._0_4_) * fVar75 + fVar75;
        fVar78 = (1.0 - auVar46._4_4_) * fVar78 + fVar78;
        fVar81 = (1.0 - auVar46._8_4_) * fVar81 + fVar81;
        fVar84 = (1.0 - auVar46._12_4_) * fVar84 + fVar84;
        fVar61 = (1.0 - auVar57._0_4_ * fVar61) * fVar61 + fVar61;
        fVar64 = (1.0 - auVar57._4_4_ * fVar64) * fVar64 + fVar64;
        fVar66 = (1.0 - auVar57._8_4_ * fVar66) * fVar66 + fVar66;
        fVar68 = (1.0 - auVar57._12_4_ * fVar68) * fVar68 + fVar68;
        pNVar29 = stack_node + 1;
        auVar57 = maxps(auVar104,ZEXT816(0));
        auVar104._4_4_ = uVar90;
        auVar104._0_4_ = uVar87;
        auVar104._8_4_ = uVar93;
        auVar104._12_4_ = uVar96;
        auVar104 = blendvps(_DAT_01f7aa00,auVar57,auVar104);
        paVar30 = &stack_near[2].field_0;
LAB_0024480e:
        aVar39 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar30[-1].v;
        paVar30 = paVar30 + -1;
        fVar103 = auVar104._0_4_;
        fVar105 = auVar104._4_4_;
        fVar106 = auVar104._8_4_;
        fVar107 = auVar104._12_4_;
        auVar34._4_4_ = -(uint)(aVar39.v[1] < fVar105);
        auVar34._0_4_ = -(uint)(aVar39.v[0] < fVar103);
        auVar34._8_4_ = -(uint)(aVar39.v[2] < fVar106);
        auVar34._12_4_ = -(uint)(aVar39._12_4_ < fVar107);
        uVar24 = movmskps((int)uVar25,auVar34);
        uVar25 = (ulong)uVar24;
        if (uVar24 != 0) {
          do {
            uVar24 = (uint)sVar28;
            fVar38 = aVar39.v[0];
            fVar41 = aVar39.v[1];
            fVar42 = aVar39.v[2];
            fVar43 = aVar39.v[3];
            if ((sVar28 & 8) != 0) {
              if (sVar28 == 0xfffffffffffffff8) goto LAB_00244b6a;
              auVar36._4_4_ = -(uint)(fVar41 < fVar105);
              auVar36._0_4_ = -(uint)(fVar38 < fVar103);
              auVar36._8_4_ = -(uint)(fVar42 < fVar106);
              auVar36._12_4_ = -(uint)(fVar43 < fVar107);
              uVar88 = movmskps((int)uVar25,auVar36);
              uVar25 = (ulong)uVar88;
              if (uVar88 != 0) {
                valid0.field_0._0_8_ = local_17a8._0_8_ ^ 0xffffffffffffffff;
                valid0.field_0.i[2] = local_17a8._8_4_ ^ 0xffffffff;
                valid0.field_0.i[3] = local_17a8._12_4_ ^ 0xffffffff;
                uVar26 = (ulong)(uVar24 & 0xf) - 8;
                uVar25 = uVar26;
                auVar40 = local_17a8;
                if (uVar26 == 0) goto LAB_00244b4b;
                prim = (Primitive_conflict4 *)(sVar28 & 0xfffffffffffffff0);
                local_17b0 = 1;
                goto LAB_00244ad0;
              }
              break;
            }
            uVar25 = sVar28 & 0xfffffffffffffff0;
            lVar27 = -0x10;
            sVar28 = 8;
            aVar39 = _DAT_01f7a9f0;
            do {
              sVar2 = *(size_t *)(uVar25 + 0x20 + lVar27 * 2);
              if (sVar2 == 8) break;
              fVar50 = *(float *)(uVar25 + 0x90 + lVar27);
              fVar51 = *(float *)(uVar25 + 0x30 + lVar27);
              fVar69 = *(float *)(uVar25 + 0x40 + lVar27);
              fVar55 = *(float *)(uVar25 + 0x50 + lVar27);
              fVar70 = *(float *)(uVar25 + 0x60 + lVar27);
              fVar19 = *(float *)(ray + 0x70);
              fVar20 = *(float *)(ray + 0x74);
              fVar21 = *(float *)(ray + 0x78);
              fVar22 = *(float *)(ray + 0x7c);
              fVar56 = *(float *)(uVar25 + 0xb0 + lVar27);
              fVar60 = *(float *)(uVar25 + 0xd0 + lVar27);
              fVar62 = *(float *)(uVar25 + 0x70 + lVar27);
              fVar72 = *(float *)(uVar25 + 0xa0 + lVar27);
              fVar73 = *(float *)(uVar25 + 0xc0 + lVar27);
              fVar74 = *(float *)(uVar25 + 0xe0 + lVar27);
              fVar1 = *(float *)(uVar25 + 0x80 + lVar27);
              fVar44 = ((fVar50 * fVar19 + fVar51) - fVar7) * fVar75;
              fVar48 = ((fVar50 * fVar20 + fVar51) - fVar8) * fVar78;
              fVar49 = ((fVar50 * fVar21 + fVar51) - fVar9) * fVar81;
              fVar50 = ((fVar50 * fVar22 + fVar51) - fVar10) * fVar84;
              fVar51 = ((fVar56 * fVar19 + fVar55) - fVar11) * fVar76;
              fVar53 = ((fVar56 * fVar20 + fVar55) - fVar12) * fVar79;
              fVar54 = ((fVar56 * fVar21 + fVar55) - fVar13) * fVar82;
              fVar55 = ((fVar56 * fVar22 + fVar55) - fVar14) * fVar85;
              fVar56 = ((fVar60 * fVar19 + fVar62) - fVar15) * fVar61;
              fVar58 = ((fVar60 * fVar20 + fVar62) - fVar16) * fVar64;
              fVar59 = ((fVar60 * fVar21 + fVar62) - fVar17) * fVar66;
              fVar60 = ((fVar60 * fVar22 + fVar62) - fVar18) * fVar68;
              fVar62 = ((fVar72 * fVar19 + fVar69) - fVar7) * fVar75;
              fVar65 = ((fVar72 * fVar20 + fVar69) - fVar8) * fVar78;
              fVar67 = ((fVar72 * fVar21 + fVar69) - fVar9) * fVar81;
              fVar69 = ((fVar72 * fVar22 + fVar69) - fVar10) * fVar84;
              fVar77 = ((fVar73 * fVar19 + fVar70) - fVar11) * fVar76;
              fVar80 = ((fVar73 * fVar20 + fVar70) - fVar12) * fVar79;
              fVar83 = ((fVar73 * fVar21 + fVar70) - fVar13) * fVar82;
              fVar86 = ((fVar73 * fVar22 + fVar70) - fVar14) * fVar85;
              fVar70 = ((fVar74 * fVar19 + fVar1) - fVar15) * fVar61;
              fVar72 = ((fVar74 * fVar20 + fVar1) - fVar16) * fVar64;
              fVar73 = ((fVar74 * fVar21 + fVar1) - fVar17) * fVar66;
              fVar74 = ((fVar74 * fVar22 + fVar1) - fVar18) * fVar68;
              uVar88 = (uint)((int)fVar62 < (int)fVar44) * (int)fVar62 |
                       (uint)((int)fVar62 >= (int)fVar44) * (int)fVar44;
              uVar91 = (uint)((int)fVar65 < (int)fVar48) * (int)fVar65 |
                       (uint)((int)fVar65 >= (int)fVar48) * (int)fVar48;
              uVar94 = (uint)((int)fVar67 < (int)fVar49) * (int)fVar67 |
                       (uint)((int)fVar67 >= (int)fVar49) * (int)fVar49;
              uVar97 = (uint)((int)fVar69 < (int)fVar50) * (int)fVar69 |
                       (uint)((int)fVar69 >= (int)fVar50) * (int)fVar50;
              uVar99 = (uint)((int)fVar77 < (int)fVar51) * (int)fVar77 |
                       (uint)((int)fVar77 >= (int)fVar51) * (int)fVar51;
              uVar100 = (uint)((int)fVar80 < (int)fVar53) * (int)fVar80 |
                        (uint)((int)fVar80 >= (int)fVar53) * (int)fVar53;
              uVar101 = (uint)((int)fVar83 < (int)fVar54) * (int)fVar83 |
                        (uint)((int)fVar83 >= (int)fVar54) * (int)fVar54;
              uVar102 = (uint)((int)fVar86 < (int)fVar55) * (int)fVar86 |
                        (uint)((int)fVar86 >= (int)fVar55) * (int)fVar55;
              uVar99 = ((int)uVar99 < (int)uVar88) * uVar88 | ((int)uVar99 >= (int)uVar88) * uVar99;
              uVar100 = ((int)uVar100 < (int)uVar91) * uVar91 |
                        ((int)uVar100 >= (int)uVar91) * uVar100;
              uVar101 = ((int)uVar101 < (int)uVar94) * uVar94 |
                        ((int)uVar101 >= (int)uVar94) * uVar101;
              uVar102 = ((int)uVar102 < (int)uVar97) * uVar97 |
                        ((int)uVar102 >= (int)uVar97) * uVar102;
              uVar88 = (uint)((int)fVar70 < (int)fVar56) * (int)fVar70 |
                       (uint)((int)fVar70 >= (int)fVar56) * (int)fVar56;
              uVar91 = (uint)((int)fVar72 < (int)fVar58) * (int)fVar72 |
                       (uint)((int)fVar72 >= (int)fVar58) * (int)fVar58;
              uVar94 = (uint)((int)fVar73 < (int)fVar59) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar59) * (int)fVar59;
              uVar97 = (uint)((int)fVar74 < (int)fVar60) * (int)fVar74 |
                       (uint)((int)fVar74 >= (int)fVar60) * (int)fVar60;
              uVar89 = ((int)uVar88 < (int)uVar99) * uVar99 | ((int)uVar88 >= (int)uVar99) * uVar88;
              uVar92 = ((int)uVar91 < (int)uVar100) * uVar100 |
                       ((int)uVar91 >= (int)uVar100) * uVar91;
              uVar95 = ((int)uVar94 < (int)uVar101) * uVar101 |
                       ((int)uVar94 >= (int)uVar101) * uVar94;
              uVar98 = ((int)uVar97 < (int)uVar102) * uVar102 |
                       ((int)uVar97 >= (int)uVar102) * uVar97;
              uVar88 = (uint)((int)fVar62 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar62 >= (int)fVar44) * (int)fVar62;
              uVar91 = (uint)((int)fVar65 < (int)fVar48) * (int)fVar48 |
                       (uint)((int)fVar65 >= (int)fVar48) * (int)fVar65;
              uVar94 = (uint)((int)fVar67 < (int)fVar49) * (int)fVar49 |
                       (uint)((int)fVar67 >= (int)fVar49) * (int)fVar67;
              uVar97 = (uint)((int)fVar69 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar69 >= (int)fVar50) * (int)fVar69;
              uVar99 = (uint)((int)fVar77 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar77 >= (int)fVar51) * (int)fVar77;
              uVar100 = (uint)((int)fVar80 < (int)fVar53) * (int)fVar53 |
                        (uint)((int)fVar80 >= (int)fVar53) * (int)fVar80;
              uVar101 = (uint)((int)fVar83 < (int)fVar54) * (int)fVar54 |
                        (uint)((int)fVar83 >= (int)fVar54) * (int)fVar83;
              uVar102 = (uint)((int)fVar86 < (int)fVar55) * (int)fVar55 |
                        (uint)((int)fVar86 >= (int)fVar55) * (int)fVar86;
              uVar99 = ((int)uVar88 < (int)uVar99) * uVar88 | ((int)uVar88 >= (int)uVar99) * uVar99;
              uVar100 = ((int)uVar91 < (int)uVar100) * uVar91 |
                        ((int)uVar91 >= (int)uVar100) * uVar100;
              uVar101 = ((int)uVar94 < (int)uVar101) * uVar94 |
                        ((int)uVar94 >= (int)uVar101) * uVar101;
              uVar102 = ((int)uVar97 < (int)uVar102) * uVar97 |
                        ((int)uVar97 >= (int)uVar102) * uVar102;
              uVar88 = (uint)((int)fVar70 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar70 >= (int)fVar56) * (int)fVar70;
              uVar91 = (uint)((int)fVar72 < (int)fVar58) * (int)fVar58 |
                       (uint)((int)fVar72 >= (int)fVar58) * (int)fVar72;
              uVar94 = (uint)((int)fVar73 < (int)fVar59) * (int)fVar59 |
                       (uint)((int)fVar73 >= (int)fVar59) * (int)fVar73;
              uVar97 = (uint)((int)fVar74 < (int)fVar60) * (int)fVar60 |
                       (uint)((int)fVar74 >= (int)fVar60) * (int)fVar74;
              uVar88 = (uint)((int)fVar103 < (int)uVar88) * (int)fVar103 |
                       ((int)fVar103 >= (int)uVar88) * uVar88;
              uVar91 = (uint)((int)fVar105 < (int)uVar91) * (int)fVar105 |
                       ((int)fVar105 >= (int)uVar91) * uVar91;
              uVar94 = (uint)((int)fVar106 < (int)uVar94) * (int)fVar106 |
                       ((int)fVar106 >= (int)uVar94) * uVar94;
              uVar97 = (uint)((int)fVar107 < (int)uVar97) * (int)fVar107 |
                       ((int)fVar107 >= (int)uVar97) * uVar97;
              local_16f8 = aVar63.i[0];
              iStack_16f4 = aVar63.i[1];
              iStack_16f0 = aVar63.i[2];
              iStack_16ec = aVar63.i[3];
              bVar31 = (float)((uint)((int)uVar89 < local_16f8) * local_16f8 |
                              ((int)uVar89 >= local_16f8) * uVar89) <=
                       (float)(((int)uVar99 < (int)uVar88) * uVar99 |
                              ((int)uVar99 >= (int)uVar88) * uVar88);
              bVar3 = (float)((uint)((int)uVar92 < iStack_16f4) * iStack_16f4 |
                             ((int)uVar92 >= iStack_16f4) * uVar92) <=
                      (float)(((int)uVar100 < (int)uVar91) * uVar100 |
                             ((int)uVar100 >= (int)uVar91) * uVar91);
              bVar4 = (float)((uint)((int)uVar95 < iStack_16f0) * iStack_16f0 |
                             ((int)uVar95 >= iStack_16f0) * uVar95) <=
                      (float)(((int)uVar101 < (int)uVar94) * uVar101 |
                             ((int)uVar101 >= (int)uVar94) * uVar94);
              bVar5 = (float)((uint)((int)uVar98 < iStack_16ec) * iStack_16ec |
                             ((int)uVar98 >= iStack_16ec) * uVar98) <=
                      (float)(((int)uVar102 < (int)uVar97) * uVar102 |
                             ((int)uVar102 >= (int)uVar97) * uVar97);
              if ((uVar24 & 7) == 6) {
                fVar50 = *(float *)(uVar25 + 0xf0 + lVar27);
                fVar51 = *(float *)(uVar25 + 0x100 + lVar27);
                bVar31 = (fVar19 < fVar51 && fVar50 <= fVar19) && bVar31;
                bVar3 = (fVar20 < fVar51 && fVar50 <= fVar20) && bVar3;
                bVar4 = (fVar21 < fVar51 && fVar50 <= fVar21) && bVar4;
                bVar5 = (fVar22 < fVar51 && fVar50 <= fVar22) && bVar5;
              }
              auVar35._0_4_ = (-(uint)(fVar38 < fVar103) & -(uint)bVar31) << 0x1f;
              auVar35._4_4_ = (-(uint)(fVar41 < fVar105) & -(uint)bVar3) << 0x1f;
              auVar35._8_4_ = (-(uint)(fVar42 < fVar106) & -(uint)bVar4) << 0x1f;
              auVar35._12_4_ = (-(uint)(fVar43 < fVar107) & -(uint)bVar5) << 0x1f;
              uVar88 = movmskps((int)valid_i,auVar35);
              valid_i = (vint<4> *)(ulong)uVar88;
              sVar23 = sVar28;
              aVar47 = aVar39;
              if ((uVar88 != 0) &&
                 (auVar6._4_4_ = uVar92, auVar6._0_4_ = uVar89, auVar6._8_4_ = uVar95,
                 auVar6._12_4_ = uVar98, aVar47.v = (__m128)blendvps(_DAT_01f7a9f0,auVar6,auVar35),
                 sVar23 = sVar2, sVar28 != 8)) {
                pNVar29->ptr = sVar28;
                pNVar29 = pNVar29 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar30->v = aVar39;
                paVar30 = paVar30 + 1;
              }
              aVar39 = aVar47;
              sVar28 = sVar23;
              lVar27 = lVar27 + 4;
            } while (lVar27 != 0);
          } while (sVar28 != 8);
        }
        goto LAB_00244a5e;
      }
LAB_00244b6a:
      auVar37._0_4_ = uVar87 & local_17a8._0_4_;
      auVar37._4_4_ = uVar90 & local_17a8._4_4_;
      auVar37._8_4_ = uVar93 & local_17a8._8_4_;
      auVar37._12_4_ = uVar96 & local_17a8._12_4_;
      auVar104 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar37);
      *(undefined1 (*) [16])(ray + 0x80) = auVar104;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    uVar25 = local_17b0 + 1;
    bVar31 = uVar26 <= local_17b0;
    local_17b0 = uVar25;
    if (bVar31) break;
LAB_00244ad0:
    valid_i = (vint<4> *)&local_16e8;
    vVar108 = InstanceArrayIntersectorKMB<4>::occluded
                        ((InstanceArrayIntersectorKMB<4> *)valid_i,&valid0,&pre,ray,context,prim);
    valid0.field_0.i[0] = ~local_16e8 & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~uStack_16e4 & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~uStack_16e0 & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~uStack_16dc & valid0.field_0.i[3];
    uVar24 = movmskps(vVar108.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar25 = (ulong)uVar24;
    if (uVar24 == 0) break;
  }
  uVar26 = CONCAT44(valid0.field_0.i[1],valid0.field_0.i[0]);
  auVar40._0_8_ = uVar26 ^ 0xffffffffffffffff;
  auVar40._8_4_ = valid0.field_0.i[2] ^ 0xffffffff;
  auVar40._12_4_ = valid0.field_0.i[3] ^ 0xffffffff;
LAB_00244b4b:
  local_17a8 = local_17a8 | auVar40;
  uVar24 = movmskps((int)uVar25,local_17a8);
  uVar25 = (ulong)uVar24;
  if (uVar24 == 0xf) goto LAB_00244b6a;
  auVar104 = blendvps(auVar104,_DAT_01f7aa00,local_17a8);
LAB_00244a5e:
  sVar28 = pNVar29[-1].ptr;
  pNVar29 = pNVar29 + -1;
  if (sVar28 == 0xfffffffffffffff8) goto LAB_00244b6a;
  goto LAB_0024480e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }